

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O2

int Abc_NtkIsAcyclicWithBoxes_rec(Abc_Obj_t *pNode)

{
  Abc_Ntk_t *pAVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  Abc_Obj_t *pAVar5;
  uint uVar6;
  char *__format;
  FILE *__stream;
  long lVar7;
  
  pAVar1 = pNode->pNtk;
  switch(*(uint *)&pNode->field_0x14 & 0xf) {
  case 2:
  case 8:
  case 10:
    return 1;
  case 6:
    __assert_fail("!Abc_ObjIsNet(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                  ,0x672,"int Abc_NtkIsAcyclicWithBoxes_rec(Abc_Obj_t *)");
  case 7:
    goto switchD_006ab030_caseD_7;
  }
  if ((*(uint *)&pNode->field_0x14 & 0xe) != 8) {
    __assert_fail("Abc_ObjIsNode(pNode) || Abc_ObjIsBox(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                  ,0x675,"int Abc_NtkIsAcyclicWithBoxes_rec(Abc_Obj_t *)");
  }
switchD_006ab030_caseD_7:
  iVar2 = Abc_NodeIsTravIdPrevious(pNode);
  if (iVar2 != 0) {
    __assert_fail("!Abc_NodeIsTravIdPrevious(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                  ,0x677,"int Abc_NtkIsAcyclicWithBoxes_rec(Abc_Obj_t *)");
  }
  iVar2 = Abc_NodeIsTravIdCurrent(pNode);
  if (iVar2 != 0) {
    fprintf(_stdout,"Network \"%s\" contains combinational loop!\n",pAVar1->pName);
    __stream = _stdout;
    if ((*(uint *)&pNode->field_0x14 & 0xe) == 8 || (*(uint *)&pNode->field_0x14 & 0xf) == 10) {
      pcVar4 = Abc_ObjName(pNode);
      __format = "Box \"%s\" is encountered twice on the following path to the COs:\n";
    }
    else {
      pcVar4 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
      __format = "Node \"%s\" is encountered twice on the following path to the COs:\n";
    }
LAB_006ab1e1:
    fprintf(__stream,__format,pcVar4);
    return 0;
  }
  Abc_NodeSetTravIdCurrent(pNode);
  lVar7 = 0;
  do {
    if ((pNode->vFanins).nSize <= lVar7) {
      uVar3 = *(uint *)&pNode->field_0x14 & 0xf;
      if ((uVar3 != 7) && (uVar3 != 10 && (*(uint *)&pNode->field_0x14 & 0xe) != 8)) {
        __assert_fail("Abc_ObjIsNode(pNode) || Abc_ObjIsBox(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                      ,0x69a,"int Abc_NtkIsAcyclicWithBoxes_rec(Abc_Obj_t *)");
      }
      Abc_NodeSetTravIdPrevious(pNode);
      return 1;
    }
    pAVar5 = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar7]];
    if ((*(uint *)&pNode->field_0x14 & 0xe) == 8 || (*(uint *)&pNode->field_0x14 & 0xf) == 10) {
      pAVar5 = (Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray];
    }
    pAVar5 = Abc_ObjFanin0Ntk(pAVar5);
    uVar3 = *(uint *)&pAVar5->field_0x14;
    uVar6 = uVar3 & 0xf;
    if (uVar6 == 5) {
      pAVar5 = (Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray];
      uVar3 = *(uint *)&pAVar5->field_0x14;
      uVar6 = uVar3 & 0xf;
    }
    switch(uVar6) {
    case 2:
    case 8:
    case 10:
      goto switchD_006ab172_caseD_2;
    default:
      if ((uVar3 & 0xe) != 8) {
        __assert_fail("Abc_ObjIsNode(pFanin) || Abc_ObjIsBox(pFanin)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                      ,0x68f,"int Abc_NtkIsAcyclicWithBoxes_rec(Abc_Obj_t *)");
      }
      break;
    case 7:
      break;
    }
    iVar2 = Abc_NodeIsTravIdPrevious(pAVar5);
    if ((iVar2 == 0) &&
       (iVar2 = Abc_NtkIsAcyclicWithBoxes_rec(pAVar5), __stream = _stdout, iVar2 == 0)) {
      if ((*(uint *)&pAVar5->field_0x14 & 0xf) != 10 && (*(uint *)&pAVar5->field_0x14 & 0xe) != 8) {
        pAVar5 = (Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray];
      }
      pcVar4 = Abc_ObjName(pAVar5);
      __format = " %s ->";
      goto LAB_006ab1e1;
    }
switchD_006ab172_caseD_2:
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

int Abc_NtkIsAcyclicWithBoxes_rec( Abc_Obj_t * pNode )
{
    Abc_Ntk_t * pNtk = pNode->pNtk;
    Abc_Obj_t * pFanin;
    int fAcyclic, i;
    assert( !Abc_ObjIsNet(pNode) );
    if ( Abc_ObjIsPi(pNode) || Abc_ObjIsLatch(pNode) || Abc_ObjIsBlackbox(pNode) )
        return 1;
    assert( Abc_ObjIsNode(pNode) || Abc_ObjIsBox(pNode) );
    // make sure the node is not visited
    assert( !Abc_NodeIsTravIdPrevious(pNode) );
    // check if the node is part of the combinational loop
    if ( Abc_NodeIsTravIdCurrent(pNode) )
    {
        fprintf( stdout, "Network \"%s\" contains combinational loop!\n", Abc_NtkName(pNtk) );
        if ( Abc_ObjIsBox(pNode) )
            fprintf( stdout, "Box \"%s\" is encountered twice on the following path to the COs:\n", Abc_ObjName(pNode) );
        else
            fprintf( stdout, "Node \"%s\" is encountered twice on the following path to the COs:\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
        return 0;
    }
    // mark this node as a node on the current path
    Abc_NodeSetTravIdCurrent( pNode );
    // visit the transitive fanin
    Abc_ObjForEachFanin( pNode, pFanin, i )
    { 
        if ( Abc_ObjIsBox(pNode) )
            pFanin = Abc_ObjFanin0(pFanin);
        pFanin = Abc_ObjFanin0Ntk(pFanin);
        if ( Abc_ObjIsBo(pFanin) )
            pFanin = Abc_ObjFanin0(pFanin);
        // check if the fanin is visited
        if ( Abc_ObjIsPi(pFanin) || Abc_ObjIsLatch(pFanin) || Abc_ObjIsBlackbox(pFanin) )
            continue;
        assert( Abc_ObjIsNode(pFanin) || Abc_ObjIsBox(pFanin) );
        if ( Abc_NodeIsTravIdPrevious(pFanin) ) 
            continue;
        // traverse the fanin's cone searching for the loop
        if ( (fAcyclic = Abc_NtkIsAcyclicWithBoxes_rec(pFanin)) )
            continue;
        // return as soon as the loop is detected
        fprintf( stdout, " %s ->", Abc_ObjName( Abc_ObjIsBox(pFanin) ? pFanin : Abc_ObjFanout0(pFanin) ) );
        return 0;
    }
    // mark this node as a visited node
    assert( Abc_ObjIsNode(pNode) || Abc_ObjIsBox(pNode) );
    Abc_NodeSetTravIdPrevious( pNode );
    return 1;
}